

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

bool __thiscall Clasp::SatBuilder::markAssigned(SatBuilder *this)

{
  bool bVar1;
  size_type sVar2;
  Literal LVar3;
  Solver *pSVar4;
  LitVec *pLVar5;
  SharedContext *in_RDI;
  LitVec *trail;
  bool ok;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar6;
  uint in_stack_ffffffffffffffcc;
  size_type sVar7;
  bool local_1;
  
  sVar7 = *(size_type *)&(in_RDI->output).hide_;
  ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
  pSVar4 = SharedContext::master((SharedContext *)0x1ca067);
  pLVar5 = Solver::trail(pSVar4);
  sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(pLVar5);
  if (sVar7 == sVar2) {
    local_1 = true;
  }
  else {
    ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
    bVar1 = SharedContext::ok(in_RDI);
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
    if (bVar1) {
      ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
      SharedContext::master((SharedContext *)0x1ca0be);
      bVar1 = Solver::propagate((Solver *)
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      in_stack_ffffffffffffffcc = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffcc);
    }
    local_1 = SUB41(in_stack_ffffffffffffffcc >> 0x18,0);
    ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
    pSVar4 = SharedContext::master((SharedContext *)0x1ca0e6);
    pLVar5 = Solver::trail(pSVar4);
    while( true ) {
      uVar6 = *(uint *)&(in_RDI->output).hide_;
      sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(pLVar5);
      if (sVar2 <= uVar6) break;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                (pLVar5,*(size_type *)&(in_RDI->output).hide_);
      LVar3 = Literal::operator~((Literal *)CONCAT44(in_stack_ffffffffffffffcc,uVar6));
      markLit((SatBuilder *)CONCAT44(LVar3.rep_,sVar7),(Literal)(uint32)((ulong)pLVar5 >> 0x20));
      *(int *)&(in_RDI->output).hide_ = *(int *)&(in_RDI->output).hide_ + 1;
    }
  }
  return local_1;
}

Assistant:

bool SatBuilder::markAssigned() {
	if (pos_ == ctx()->master()->trail().size()) { return true; }
	bool ok = ctx()->ok() && ctx()->master()->propagate();
	for (const LitVec& trail = ctx()->master()->trail(); pos_ < trail.size(); ++pos_) {
		markLit(~trail[pos_]);
	}
	return ok;
}